

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O1

void __thiscall async_writer::run(async_writer *this)

{
  stream_socket *psVar1;
  char *p;
  pointer pcVar2;
  ulong uVar3;
  uint uVar4;
  size_type __new_size;
  vector<char,_std::allocator<char>_> *this_00;
  bool bVar5;
  mutable_buffer tmp;
  callback<void_(const_std::error_code_&,_unsigned_long)> local_78;
  buffer_impl<char_*> local_70;
  const_buffer local_40;
  
  this_00 = this->buf;
  pcVar2 = (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar5 = (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
          ._M_finish != pcVar2;
  if (bVar5) {
    __new_size = 0;
    for (uVar4 = this->counter; uVar4 < 100000; uVar4 = this->counter + uVar4) {
      pcVar2[__new_size] = (char)uVar4 + (char)(uVar4 / 100) * -100;
      uVar4 = (int)__new_size + 1;
      __new_size = (size_type)uVar4;
      this_00 = this->buf;
      pcVar2 = (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = (long)(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar2;
      bVar5 = __new_size < uVar3;
      if (uVar3 <= __new_size) goto LAB_0010fd37;
    }
    if (bVar5) {
      std::vector<char,_std::allocator<char>_>::resize(this_00,__new_size);
    }
  }
LAB_0010fd37:
  psVar1 = this->sock;
  p = (this->buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start;
  local_70.size_ = 0;
  local_70.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  booster::aio::buffer_impl<char_*>::add
            (&local_70,p,
             (long)(this->buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)p);
  booster::aio::const_buffer::const_buffer(&local_40,(mutable_buffer *)&local_70);
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::callback<async_writer>
            (&local_78,*this);
  booster::aio::stream_socket::async_write_some((const_buffer *)psVar1,(callback *)&local_40);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&local_78.call_ptr);
  if (local_40.super_buffer_impl<const_char_*>.vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super_buffer_impl<const_char_*>.vec_.
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.vec_.
      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.vec_.
                    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void run()
	{
		unsigned i;
		for(i=0;i<buf->size() && counter+i < 100000;i++)
			buf->at(i)=char((counter + i) % 100);
		if(i < buf->size())
			buf->resize(i);
		sock->async_write_some(io::buffer(*buf),*this);
	}